

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_internal.h
# Opt level: O1

void __thiscall
absl::cord_internal::InlineData::set_inline_data(InlineData *this,char *data,size_t n)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  
  if (n < 0x10) {
    (this->rep_).field_0.data[0] = (char)n * '\x02';
    if (n < 8) {
      if (n < 4) {
        if (n != 0) {
          (this->rep_).field_0.data[1] = *data;
          (this->rep_).field_0.data[(n >> 1) + 1] = data[n >> 1];
          (this->rep_).field_0.data[n] = data[n - 1];
        }
        (this->rep_).field_0.as_tree.rep = (CordRep *)0x0;
        *(undefined8 *)((long)&(this->rep_).field_0 + n + 1) = 0;
      }
      else {
        uVar1 = *(undefined4 *)data;
        uVar2 = *(undefined4 *)(data + (n - 4));
        *(undefined4 *)((long)&(this->rep_).field_0 + 5) = 0;
        (this->rep_).field_0.as_tree.rep = (CordRep *)0x0;
        *(undefined4 *)((long)&(this->rep_).field_0 + 1) = uVar1;
        *(undefined4 *)((long)this + (n - 3)) = uVar2;
      }
    }
    else {
      if (0xf < n) goto LAB_00136131;
      uVar3 = *(undefined8 *)data;
      uVar4 = *(undefined8 *)(data + (n - 8));
      (this->rep_).field_0.as_tree.rep = (CordRep *)0x0;
      *(undefined8 *)((long)&(this->rep_).field_0.as_tree.cordz_info + 1) = uVar3;
      *(undefined8 *)((long)this + (n - 7)) = uVar4;
    }
    return;
  }
  set_inline_data();
LAB_00136131:
  __assert_fail("n <= 15",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]pawn/build_O1/_deps/absl-src/absl/strings/internal/cord_internal.h"
                ,0x60,
                "void absl::cord_internal::SmallMemmove(char *, const char *, size_t) [nullify_tail = true]"
               );
}

Assistant:

void set_inline_data(const char* data, size_t n) {
    ABSL_ASSERT(n <= kMaxInline);
    unpoison();
    rep_.set_tag(static_cast<int8_t>(n << 1));
    SmallMemmove<true>(rep_.as_chars(), data, n);
    poison();
  }